

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::ROIAlign_x86_avx512::forward
          (ROIAlign_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  pointer pMVar3;
  Mat *this_00;
  size_t sVar4;
  size_t sVar5;
  _func_int **pp_Var6;
  void *pvVar7;
  bool bVar8;
  bool bVar9;
  ulong uVar10;
  ulong uVar11;
  _func_int *p_Var12;
  uint uVar13;
  _func_int *p_Var14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  void *pvVar26;
  void *pvVar27;
  int iVar28;
  undefined8 unaff_R13;
  void *pvVar29;
  ushort uVar30;
  byte bVar31;
  byte bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar51 [32];
  undefined1 auVar53 [32];
  undefined1 auVar41 [16];
  undefined1 auVar54 [32];
  undefined1 auVar42 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar65 [32];
  undefined1 auVar49 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar55 [32];
  undefined1 auVar43 [16];
  undefined1 auVar56 [32];
  undefined1 auVar44 [16];
  undefined1 auVar57 [32];
  undefined1 auVar45 [16];
  undefined1 auVar58 [32];
  undefined1 auVar46 [16];
  undefined1 auVar77 [64];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  float fVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [64];
  float fVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [12];
  undefined1 in_ZMM6 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar94;
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  undefined1 in_ZMM25 [64];
  undefined1 in_ZMM26 [64];
  undefined1 in_XMM29 [16];
  allocator_type local_d9;
  void *local_d8;
  ulong local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  void *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  ROIAlign_x86_avx512 *local_80;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> pre_calc;
  undefined1 auVar52 [32];
  undefined1 auVar50 [32];
  
  auVar91 = in_ZMM6._4_12_;
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar21 = pMVar3->w;
  iVar17 = pMVar3->h;
  local_d0 = (ulong)(uint)pMVar3->c;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,*(int *)(&this->field_0xd0 + (long)this->_vptr_ROIAlign_x86_avx512[-3]),
              *(int *)(&this->field_0xd4 + (long)this->_vptr_ROIAlign_x86_avx512[-3]),pMVar3->c,
              pMVar3->elemsize,opt->blob_allocator);
  iVar28 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    p_Var12 = this->_vptr_ROIAlign_x86_avx512[-3];
    fVar86 = *(float *)(&this->field_0xd8 + (long)p_Var12);
    uVar1 = *pMVar3[1].data;
    uVar2 = *(undefined8 *)((long)pMVar3[1].data + 8);
    local_b8._0_4_ = fVar86 * (float)uVar1;
    local_b8._4_4_ = fVar86 * (float)((ulong)uVar1 >> 0x20);
    local_b8._8_4_ = fVar86 * 0.0;
    local_b8._12_4_ = fVar86 * 0.0;
    auVar47._0_4_ = (float)uVar2 * fVar86;
    auVar47._4_4_ = (float)((ulong)uVar2 >> 0x20) * fVar86;
    auVar47._8_4_ = fVar86 * 0.0;
    auVar47._12_4_ = fVar86 * 0.0;
    auVar47 = vsubps_avx(auVar47,local_b8);
    if ((&this->field_0xe0)[(long)p_Var12] == '\x01') {
      auVar34._8_4_ = 0xbf000000;
      auVar34._0_8_ = 0xbf000000bf000000;
      auVar34._12_4_ = 0xbf000000;
      local_b8 = vaddps_avx512vl(local_b8,auVar34);
    }
    else {
      auVar33._8_4_ = 0x3f800000;
      auVar33._0_8_ = 0x3f8000003f800000;
      auVar33._12_4_ = 0x3f800000;
      auVar47 = vmaxps_avx512vl(auVar47,auVar33);
    }
    uVar22 = *(ulong *)(&this->field_0xd0 + (long)p_Var12);
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar22;
    auVar33 = vcvtdq2ps_avx(auVar81);
    auVar34 = vrcpps_avx(auVar33);
    auVar35._0_4_ = auVar47._0_4_ * auVar34._0_4_;
    auVar35._4_4_ = auVar47._4_4_ * auVar34._4_4_;
    auVar35._8_4_ = auVar47._8_4_ * auVar34._8_4_;
    auVar35._12_4_ = auVar47._12_4_ * auVar34._12_4_;
    auVar47 = vfmsub213ps_fma(auVar33,auVar35,auVar47);
    local_c8 = vfnmadd213ps_fma(auVar47,auVar34,auVar35);
    iVar28 = (int)(uVar22 >> 0x20);
    local_80 = this;
    if (*(int *)(&this->field_0xe4 + (long)p_Var12) == 1) {
      bVar8 = 0 < *(int *)(&this->field_0xdc + (long)p_Var12);
      fVar86 = (float)*(int *)(&this->field_0xdc + (long)p_Var12);
      local_98 = vmovshdup_avx(local_c8);
      auVar47 = vroundss_avx(local_98,local_98,10);
      auVar33 = vroundss_avx(local_c8,local_c8,10);
      uVar13 = (uint)(float)((uint)bVar8 * (int)fVar86 + (uint)!bVar8 * auVar47._0_4_);
      lVar25 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar13);
      local_d8 = (void *)CONCAT44(local_d8._4_4_,iVar17);
      iVar17 = (int)(float)((uint)bVar8 * (int)fVar86 + (uint)!bVar8 * auVar33._0_4_);
      local_a0 = CONCAT44(local_a0._4_4_,iVar21);
      local_a8 = (void *)(long)iVar17;
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,(long)iVar28 * (long)(int)uVar13 * (long)(int)uVar22 * (long)local_a8,
                 &local_d9);
      auVar47 = vmovshdup_avx(local_b8);
      detectron2_pre_calc_for_bilinear_interpolate<float>
                ((int)local_d8,(int)local_a0,
                 *(int *)(&this->field_0xd4 + (long)this->_vptr_ROIAlign_x86_avx512[-3]),
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_ROIAlign_x86_avx512[-3]),uVar13,
                 (int)local_a8,auVar47._0_4_,local_b8._0_4_,(float)local_98._0_4_,
                 (float)local_c8._0_4_,uVar13,(int)local_a8,&pre_calc);
      if (0 < (int)local_d0) {
        iVar21 = 1;
        if (1 < (int)(uVar13 * iVar17)) {
          iVar21 = uVar13 * iVar17;
        }
        pvVar26 = pMVar3->data;
        local_98._0_8_ = pvVar26;
        lVar18 = pMVar3->cstep * pMVar3->elemsize;
        local_b8._0_8_ = lVar18;
        pvVar7 = this_00->data;
        local_c8._0_8_ = pvVar7;
        local_d8 = (void *)(this_00->cstep * this_00->elemsize);
        pp_Var6 = this->_vptr_ROIAlign_x86_avx512;
        uVar22 = 0;
        p_Var12 = pp_Var6[-3];
        uVar15 = (ulong)(iVar17 + 0xfU & 0xfffffff0);
        auVar67 = vpbroadcastq_avx512f();
        auVar68 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar69 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar70 = vpbroadcastq_avx512f(ZEXT816(0x10));
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)p_Var12)) {
            pvVar27 = (void *)(lVar18 * uVar22 + (long)pvVar26);
            pvVar29 = (void *)((long)local_d8 * uVar22 + (long)pvVar7);
            iVar28 = 0;
            do {
              lVar16 = (long)*(int *)(&this->field_0xd0 + (long)p_Var12);
              if (0 < lVar16) {
                lVar19 = 0;
                do {
                  auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar86 = 0.0;
                  if (0 < (int)uVar13) {
                    uVar24 = 0;
                    auVar85 = vpbroadcastq_avx512f();
                    do {
                      if (0 < iVar17) {
                        auVar72 = vpbroadcastq_avx512f();
                        auVar73 = vpaddq_avx512f(auVar72,auVar68);
                        auVar72 = vpaddq_avx512f(auVar72,auVar69);
                        uVar20 = 0;
                        auVar71 = ZEXT1264(CONCAT84(SUB128(ZEXT812(0),4),auVar71._0_4_));
                        do {
                          auVar77 = auVar71;
                          auVar71 = vpbroadcastq_avx512f();
                          auVar74 = vporq_avx512f(auVar71,auVar68);
                          auVar71 = vporq_avx512f(auVar71,auVar69);
                          uVar10 = vpcmpuq_avx512f(auVar71,auVar67,2);
                          uVar11 = vpcmpuq_avx512f(auVar74,auVar67,2);
                          bVar32 = (byte)uVar11;
                          bVar31 = (byte)uVar10;
                          uVar30 = CONCAT11(bVar32,bVar31);
                          auVar71 = vpsllq_avx512f(auVar72,5);
                          vpaddq_avx512f(auVar85,auVar71);
                          auVar71 = vpsllq_avx512f(auVar73,5);
                          vpaddq_avx512f(auVar85,auVar71);
                          auVar50 = vgatherqps_avx512f(*(undefined8 *)(lVar25 + 0x10));
                          auVar59._8_8_ = (ulong)((byte)(uVar11 >> 1) & 1) * auVar50._8_8_;
                          auVar59._0_8_ = (ulong)(bVar32 & 1) * auVar50._0_8_;
                          auVar59._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * auVar50._16_8_;
                          auVar59._24_8_ = (ulong)((byte)(uVar11 >> 3) & 1) * auVar50._24_8_;
                          auVar50 = vgatherqps_avx512f(*(undefined8 *)((long)pvVar27 + 0x10));
                          auVar71 = vinsertf64x4_avx512f
                                              (ZEXT3264(CONCAT824((ulong)((byte)(uVar10 >> 3) & 1) *
                                                                  auVar50._24_8_,
                                                                  CONCAT816((ulong)((byte)(uVar10 >>
                                                                                          2) & 1) *
                                                                            auVar50._16_8_,
                                                                            CONCAT88((ulong)((byte)(
                                                  uVar10 >> 1) & 1) * auVar50._8_8_,
                                                  (ulong)(bVar31 & 1) * auVar50._0_8_)))),auVar59,1)
                          ;
                          auVar50 = vpgatherqd_avx512f(*(undefined8 *)
                                                        ((long)&(pre_calc.
                                                  super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->pos1 +
                                                  uVar24));
                          auVar60._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar50._4_4_;
                          auVar60._0_4_ = (uint)(bVar32 & 1) * auVar50._0_4_;
                          auVar60._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar50._8_4_;
                          auVar60._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar50._12_4_;
                          auVar60._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar50._16_4_;
                          auVar60._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar50._20_4_;
                          auVar60._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar50._24_4_;
                          auVar60._28_4_ = (uint)(byte)(uVar11 >> 7) * auVar50._28_4_;
                          auVar50 = vpgatherqd_avx512f(*(undefined8 *)
                                                        ((long)&(pre_calc.
                                                  super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->pos1 +
                                                  uVar15));
                          vinserti64x4_avx512f
                                    (ZEXT3264(CONCAT428((uint)(byte)(uVar10 >> 7) * auVar50._28_4_,
                                                        CONCAT424((uint)((byte)(uVar10 >> 6) & 1) *
                                                                  auVar50._24_4_,
                                                                  CONCAT420((uint)((byte)(uVar10 >>
                                                                                         5) & 1) *
                                                                            auVar50._20_4_,
                                                                            CONCAT416((uint)((byte)(
                                                  uVar10 >> 4) & 1) * auVar50._16_4_,
                                                  CONCAT412((uint)((byte)(uVar10 >> 3) & 1) *
                                                            auVar50._12_4_,
                                                            CONCAT48((uint)((byte)(uVar10 >> 2) & 1)
                                                                     * auVar50._8_4_,
                                                                     CONCAT44((uint)((byte)(uVar10 
                                                  >> 1) & 1) * auVar50._4_4_,
                                                  (uint)(bVar31 & 1) * auVar50._0_4_)))))))),auVar60
                                     ,1);
                          auVar75 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar27 + uVar24 * 4));
                          auVar74._4_4_ = (uint)((byte)(uVar30 >> 1) & 1) * auVar75._4_4_;
                          auVar74._0_4_ = (uint)(bVar31 & 1) * auVar75._0_4_;
                          auVar74._8_4_ = (uint)((byte)(uVar30 >> 2) & 1) * auVar75._8_4_;
                          auVar74._12_4_ = (uint)((byte)(uVar30 >> 3) & 1) * auVar75._12_4_;
                          auVar74._16_4_ = (uint)((byte)(uVar30 >> 4) & 1) * auVar75._16_4_;
                          auVar74._20_4_ = (uint)((byte)(uVar30 >> 5) & 1) * auVar75._20_4_;
                          auVar74._24_4_ = (uint)((byte)(uVar30 >> 6) & 1) * auVar75._24_4_;
                          auVar74._28_4_ = (uint)((byte)(uVar30 >> 7) & 1) * auVar75._28_4_;
                          auVar74._32_4_ = (uint)(bVar32 & 1) * auVar75._32_4_;
                          auVar74._36_4_ = (uint)(bVar32 >> 1 & 1) * auVar75._36_4_;
                          auVar74._40_4_ = (uint)(bVar32 >> 2 & 1) * auVar75._40_4_;
                          auVar74._44_4_ = (uint)(bVar32 >> 3 & 1) * auVar75._44_4_;
                          auVar74._48_4_ = (uint)(bVar32 >> 4 & 1) * auVar75._48_4_;
                          auVar74._52_4_ = (uint)(bVar32 >> 5 & 1) * auVar75._52_4_;
                          auVar74._56_4_ = (uint)(bVar32 >> 6 & 1) * auVar75._56_4_;
                          auVar74._60_4_ = (uint)(bVar32 >> 7) * auVar75._60_4_;
                          auVar50 = vgatherqps_avx512f(*(undefined8 *)(lVar25 + 0x14));
                          auVar61._8_8_ = (ulong)((byte)(uVar11 >> 1) & 1) * auVar50._8_8_;
                          auVar61._0_8_ = (ulong)(bVar32 & 1) * auVar50._0_8_;
                          auVar61._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * auVar50._16_8_;
                          auVar61._24_8_ = (ulong)((byte)(uVar11 >> 3) & 1) * auVar50._24_8_;
                          auVar50 = vgatherqps_avx512f(*(undefined8 *)((long)pvVar27 + 0x14));
                          auVar75 = vinsertf64x4_avx512f
                                              (ZEXT3264(CONCAT824((ulong)((byte)(uVar10 >> 3) & 1) *
                                                                  auVar50._24_8_,
                                                                  CONCAT816((ulong)((byte)(uVar10 >>
                                                                                          2) & 1) *
                                                                            auVar50._16_8_,
                                                                            CONCAT88((ulong)((byte)(
                                                  uVar10 >> 1) & 1) * auVar50._8_8_,
                                                  (ulong)(bVar31 & 1) * auVar50._0_8_)))),auVar61,1)
                          ;
                          auVar50 = vpgatherqd_avx512f(*(undefined8 *)(lVar25 + 4));
                          auVar62._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar50._4_4_;
                          auVar62._0_4_ = (uint)(bVar32 & 1) * auVar50._0_4_;
                          auVar62._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar50._8_4_;
                          auVar62._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar50._12_4_;
                          auVar62._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar50._16_4_;
                          auVar62._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar50._20_4_;
                          auVar62._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar50._24_4_;
                          auVar62._28_4_ = (uint)(byte)(uVar11 >> 7) * auVar50._28_4_;
                          auVar47 = vpxord_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
                          auVar50 = vpgatherqd_avx512f(*(undefined8 *)((long)pvVar27 + 4));
                          auVar48._0_4_ =
                               (uint)(bVar31 & 1) * auVar50._0_4_ |
                               (uint)!(bool)(bVar31 & 1) * auVar47._0_4_;
                          bVar8 = (bool)((byte)(uVar10 >> 1) & 1);
                          auVar48._4_4_ = (uint)bVar8 * auVar50._4_4_ | (uint)!bVar8 * auVar47._4_4_
                          ;
                          bVar8 = (bool)((byte)(uVar10 >> 2) & 1);
                          auVar48._8_4_ = (uint)bVar8 * auVar50._8_4_ | (uint)!bVar8 * auVar47._8_4_
                          ;
                          bVar8 = (bool)((byte)(uVar10 >> 3) & 1);
                          auVar48._12_4_ =
                               (uint)bVar8 * auVar50._12_4_ | (uint)!bVar8 * auVar47._12_4_;
                          vinserti64x4_avx512f
                                    (ZEXT3264(CONCAT428((uint)(byte)(uVar10 >> 7) * auVar50._28_4_,
                                                        CONCAT424((uint)((byte)(uVar10 >> 6) & 1) *
                                                                  auVar50._24_4_,
                                                                  CONCAT420((uint)((byte)(uVar10 >>
                                                                                         5) & 1) *
                                                                            auVar50._20_4_,
                                                                            CONCAT416((uint)((byte)(
                                                  uVar10 >> 4) & 1) * auVar50._16_4_,auVar48))))),
                                     auVar62,1);
                          auVar47 = vpxord_avx512vl(auVar48,auVar48);
                          auVar76 = vgatherdps_avx512f(*(undefined4 *)
                                                        ((long)pvVar27 + (long)pvVar29 * 4));
                          in_ZMM16._0_4_ =
                               (uint)(bVar31 & 1) * auVar76._0_4_ |
                               (uint)!(bool)(bVar31 & 1) * auVar47._0_4_;
                          bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
                          in_ZMM16._4_4_ =
                               (uint)bVar8 * auVar76._4_4_ | (uint)!bVar8 * auVar47._4_4_;
                          bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
                          in_ZMM16._8_4_ =
                               (uint)bVar8 * auVar76._8_4_ | (uint)!bVar8 * auVar47._8_4_;
                          bVar8 = (bool)((byte)(uVar30 >> 3) & 1);
                          in_ZMM16._12_4_ =
                               (uint)bVar8 * auVar76._12_4_ | (uint)!bVar8 * auVar47._12_4_;
                          in_ZMM16._16_4_ = (uint)((byte)(uVar30 >> 4) & 1) * auVar76._16_4_;
                          in_ZMM16._20_4_ = (uint)((byte)(uVar30 >> 5) & 1) * auVar76._20_4_;
                          in_ZMM16._24_4_ = (uint)((byte)(uVar30 >> 6) & 1) * auVar76._24_4_;
                          in_ZMM16._28_4_ = (uint)((byte)(uVar30 >> 7) & 1) * auVar76._28_4_;
                          in_ZMM16._32_4_ = (uint)(bVar32 & 1) * auVar76._32_4_;
                          in_ZMM16._36_4_ = (uint)(bVar32 >> 1 & 1) * auVar76._36_4_;
                          in_ZMM16._40_4_ = (uint)(bVar32 >> 2 & 1) * auVar76._40_4_;
                          in_ZMM16._44_4_ = (uint)(bVar32 >> 3 & 1) * auVar76._44_4_;
                          in_ZMM16._48_4_ = (uint)(bVar32 >> 4 & 1) * auVar76._48_4_;
                          in_ZMM16._52_4_ = (uint)(bVar32 >> 5 & 1) * auVar76._52_4_;
                          in_ZMM16._56_4_ = (uint)(bVar32 >> 6 & 1) * auVar76._56_4_;
                          in_ZMM16._60_4_ = (uint)(bVar32 >> 7) * auVar76._60_4_;
                          auVar50 = vgatherqps_avx512f(*(undefined8 *)(lVar25 + 0x18));
                          auVar63._8_8_ = (ulong)((byte)(uVar11 >> 1) & 1) * auVar50._8_8_;
                          auVar63._0_8_ = (ulong)(bVar32 & 1) * auVar50._0_8_;
                          auVar63._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * auVar50._16_8_;
                          auVar63._24_8_ = (ulong)((byte)(uVar11 >> 3) & 1) * auVar50._24_8_;
                          auVar47 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
                          auVar50 = vgatherqps_avx512f(*(undefined8 *)((long)pvVar27 + 0x18));
                          auVar36._0_8_ =
                               (ulong)(bVar31 & 1) * auVar50._0_8_ |
                               (ulong)!(bool)(bVar31 & 1) * auVar47._0_8_;
                          bVar8 = (bool)((byte)(uVar10 >> 1) & 1);
                          auVar36._8_8_ =
                               (ulong)bVar8 * auVar50._8_8_ | (ulong)!bVar8 * auVar47._8_8_;
                          auVar76 = vinsertf64x4_avx512f
                                              (ZEXT3264(CONCAT824((ulong)((byte)(uVar10 >> 3) & 1) *
                                                                  auVar50._24_8_,
                                                                  CONCAT816((ulong)((byte)(uVar10 >>
                                                                                          2) & 1) *
                                                                            auVar50._16_8_,auVar36))
                                                       ),auVar63,1);
                          auVar47 = vxorps_avx512vl(auVar36,auVar36);
                          auVar50 = vpgatherqd_avx512f(*(undefined8 *)(lVar25 + 8));
                          auVar64._0_4_ =
                               (uint)(bVar32 & 1) * auVar50._0_4_ |
                               (uint)!(bool)(bVar32 & 1) * auVar47._0_4_;
                          bVar8 = (bool)((byte)(uVar11 >> 1) & 1);
                          auVar64._4_4_ = (uint)bVar8 * auVar50._4_4_ | (uint)!bVar8 * auVar47._4_4_
                          ;
                          bVar8 = (bool)((byte)(uVar11 >> 2) & 1);
                          auVar64._8_4_ = (uint)bVar8 * auVar50._8_4_ | (uint)!bVar8 * auVar47._8_4_
                          ;
                          bVar8 = (bool)((byte)(uVar11 >> 3) & 1);
                          auVar64._12_4_ =
                               (uint)bVar8 * auVar50._12_4_ | (uint)!bVar8 * auVar47._12_4_;
                          auVar64._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar50._16_4_;
                          auVar64._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar50._20_4_;
                          auVar64._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar50._24_4_;
                          auVar64._28_4_ = (uint)(byte)(uVar11 >> 7) * auVar50._28_4_;
                          auVar47 = vpxord_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
                          auVar50 = vpgatherqd_avx512f(*(undefined8 *)((long)pvVar27 + 8));
                          auVar37._0_4_ =
                               (uint)(bVar31 & 1) * auVar50._0_4_ |
                               (uint)!(bool)(bVar31 & 1) * auVar47._0_4_;
                          bVar8 = (bool)((byte)(uVar10 >> 1) & 1);
                          auVar37._4_4_ = (uint)bVar8 * auVar50._4_4_ | (uint)!bVar8 * auVar47._4_4_
                          ;
                          bVar8 = (bool)((byte)(uVar10 >> 2) & 1);
                          auVar37._8_4_ = (uint)bVar8 * auVar50._8_4_ | (uint)!bVar8 * auVar47._8_4_
                          ;
                          bVar8 = (bool)((byte)(uVar10 >> 3) & 1);
                          auVar37._12_4_ =
                               (uint)bVar8 * auVar50._12_4_ | (uint)!bVar8 * auVar47._12_4_;
                          auVar78 = vinserti64x4_avx512f
                                              (ZEXT3264(CONCAT428((uint)(byte)(uVar10 >> 7) *
                                                                  auVar50._28_4_,
                                                                  CONCAT424((uint)((byte)(uVar10 >>
                                                                                         6) & 1) *
                                                                            auVar50._24_4_,
                                                                            CONCAT420((uint)((byte)(
                                                  uVar10 >> 5) & 1) * auVar50._20_4_,
                                                  CONCAT416((uint)((byte)(uVar10 >> 4) & 1) *
                                                            auVar50._16_4_,auVar37))))),auVar64,1);
                          auVar47 = vpxord_avx512vl(auVar37,auVar37);
                          auVar79 = vgatherdps_avx512f(*(undefined4 *)
                                                        ((long)pvVar27 +
                                                        (long)pre_calc.
                                                  super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start * 4));
                          in_ZMM18._0_4_ =
                               (uint)(bVar31 & 1) * auVar79._0_4_ |
                               (uint)!(bool)(bVar31 & 1) * auVar47._0_4_;
                          bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
                          in_ZMM18._4_4_ =
                               (uint)bVar8 * auVar79._4_4_ | (uint)!bVar8 * auVar47._4_4_;
                          bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
                          in_ZMM18._8_4_ =
                               (uint)bVar8 * auVar79._8_4_ | (uint)!bVar8 * auVar47._8_4_;
                          bVar8 = (bool)((byte)(uVar30 >> 3) & 1);
                          in_ZMM18._12_4_ =
                               (uint)bVar8 * auVar79._12_4_ | (uint)!bVar8 * auVar47._12_4_;
                          in_ZMM18._16_4_ = (uint)((byte)(uVar30 >> 4) & 1) * auVar79._16_4_;
                          in_ZMM18._20_4_ = (uint)((byte)(uVar30 >> 5) & 1) * auVar79._20_4_;
                          in_ZMM18._24_4_ = (uint)((byte)(uVar30 >> 6) & 1) * auVar79._24_4_;
                          in_ZMM18._28_4_ = (uint)((byte)(uVar30 >> 7) & 1) * auVar79._28_4_;
                          in_ZMM18._32_4_ = (uint)(bVar32 & 1) * auVar79._32_4_;
                          in_ZMM18._36_4_ = (uint)(bVar32 >> 1 & 1) * auVar79._36_4_;
                          in_ZMM18._40_4_ = (uint)(bVar32 >> 2 & 1) * auVar79._40_4_;
                          in_ZMM18._44_4_ = (uint)(bVar32 >> 3 & 1) * auVar79._44_4_;
                          in_ZMM18._48_4_ = (uint)(bVar32 >> 4 & 1) * auVar79._48_4_;
                          in_ZMM18._52_4_ = (uint)(bVar32 >> 5 & 1) * auVar79._52_4_;
                          in_ZMM18._56_4_ = (uint)(bVar32 >> 6 & 1) * auVar79._56_4_;
                          in_ZMM18._60_4_ = (uint)(bVar32 >> 7) * auVar79._60_4_;
                          auVar47 = vxorps_avx512vl(auVar78._0_16_,auVar78._0_16_);
                          auVar50 = vgatherqps_avx512f(*(undefined8 *)(lVar25 + 0x1c));
                          auVar65._0_8_ =
                               (ulong)(bVar32 & 1) * auVar50._0_8_ |
                               (ulong)!(bool)(bVar32 & 1) * auVar47._0_8_;
                          bVar8 = (bool)((byte)(uVar11 >> 1) & 1);
                          auVar65._8_8_ =
                               (ulong)bVar8 * auVar50._8_8_ | (ulong)!bVar8 * auVar47._8_8_;
                          auVar65._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * auVar50._16_8_;
                          auVar65._24_8_ = (ulong)((byte)(uVar11 >> 3) & 1) * auVar50._24_8_;
                          auVar47 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
                          auVar50 = vgatherqps_avx512f(*(undefined8 *)((long)pvVar27 + 0x1c));
                          auVar49._0_8_ =
                               (ulong)(bVar31 & 1) * auVar50._0_8_ |
                               (ulong)!(bool)(bVar31 & 1) * auVar47._0_8_;
                          bVar8 = (bool)((byte)(uVar10 >> 1) & 1);
                          auVar49._8_8_ =
                               (ulong)bVar8 * auVar50._8_8_ | (ulong)!bVar8 * auVar47._8_8_;
                          in_ZMM17 = vinsertf64x4_avx512f
                                               (ZEXT3264(CONCAT824((ulong)((byte)(uVar10 >> 3) & 1)
                                                                   * auVar50._24_8_,
                                                                   CONCAT816((ulong)((byte)(uVar10 
                                                  >> 2) & 1) * auVar50._16_8_,auVar49))),auVar65,1);
                          auVar47 = vxorps_avx512vl(auVar49,auVar49);
                          auVar50 = vpgatherqd_avx512f(*(undefined8 *)(lVar25 + 0xc));
                          auVar66._0_4_ =
                               (uint)(bVar32 & 1) * auVar50._0_4_ |
                               (uint)!(bool)(bVar32 & 1) * auVar47._0_4_;
                          bVar8 = (bool)((byte)(uVar11 >> 1) & 1);
                          auVar66._4_4_ = (uint)bVar8 * auVar50._4_4_ | (uint)!bVar8 * auVar47._4_4_
                          ;
                          bVar8 = (bool)((byte)(uVar11 >> 2) & 1);
                          auVar66._8_4_ = (uint)bVar8 * auVar50._8_4_ | (uint)!bVar8 * auVar47._8_4_
                          ;
                          bVar8 = (bool)((byte)(uVar11 >> 3) & 1);
                          auVar66._12_4_ =
                               (uint)bVar8 * auVar50._12_4_ | (uint)!bVar8 * auVar47._12_4_;
                          auVar66._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar50._16_4_;
                          auVar66._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar50._20_4_;
                          auVar66._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar50._24_4_;
                          auVar66._28_4_ = (uint)(byte)(uVar11 >> 7) * auVar50._28_4_;
                          in_ZMM19 = ZEXT3264(auVar66);
                          auVar50 = vpgatherqd_avx512f(*(undefined8 *)((long)pvVar27 + 0xc));
                          vinserti64x4_avx512f
                                    (ZEXT3264(CONCAT428((uint)(byte)(uVar10 >> 7) * auVar50._28_4_,
                                                        CONCAT424((uint)((byte)(uVar10 >> 6) & 1) *
                                                                  auVar50._24_4_,
                                                                  CONCAT420((uint)((byte)(uVar10 >>
                                                                                         5) & 1) *
                                                                            auVar50._20_4_,
                                                                            CONCAT416((uint)((byte)(
                                                  uVar10 >> 4) & 1) * auVar50._16_4_,
                                                  CONCAT412((uint)((byte)(uVar10 >> 3) & 1) *
                                                            auVar50._12_4_,
                                                            CONCAT48((uint)((byte)(uVar10 >> 2) & 1)
                                                                     * auVar50._8_4_,
                                                                     CONCAT44((uint)((byte)(uVar10 
                                                  >> 1) & 1) * auVar50._4_4_,
                                                  (uint)(bVar31 & 1) * auVar50._0_4_)))))))),auVar66
                                     ,1);
                          auVar78 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar27 * 5));
                          auVar79._4_4_ = (uint)((byte)(uVar30 >> 1) & 1) * auVar78._4_4_;
                          auVar79._0_4_ = (uint)(bVar31 & 1) * auVar78._0_4_;
                          auVar79._8_4_ = (uint)((byte)(uVar30 >> 2) & 1) * auVar78._8_4_;
                          auVar79._12_4_ = (uint)((byte)(uVar30 >> 3) & 1) * auVar78._12_4_;
                          auVar79._16_4_ = (uint)((byte)(uVar30 >> 4) & 1) * auVar78._16_4_;
                          auVar79._20_4_ = (uint)((byte)(uVar30 >> 5) & 1) * auVar78._20_4_;
                          auVar79._24_4_ = (uint)((byte)(uVar30 >> 6) & 1) * auVar78._24_4_;
                          auVar79._28_4_ = (uint)((byte)(uVar30 >> 7) & 1) * auVar78._28_4_;
                          auVar79._32_4_ = (uint)(bVar32 & 1) * auVar78._32_4_;
                          auVar79._36_4_ = (uint)(bVar32 >> 1 & 1) * auVar78._36_4_;
                          auVar79._40_4_ = (uint)(bVar32 >> 2 & 1) * auVar78._40_4_;
                          auVar79._44_4_ = (uint)(bVar32 >> 3 & 1) * auVar78._44_4_;
                          auVar79._48_4_ = (uint)(bVar32 >> 4 & 1) * auVar78._48_4_;
                          auVar79._52_4_ = (uint)(bVar32 >> 5 & 1) * auVar78._52_4_;
                          auVar79._56_4_ = (uint)(bVar32 >> 6 & 1) * auVar78._56_4_;
                          auVar79._60_4_ = (uint)(bVar32 >> 7) * auVar78._60_4_;
                          auVar71 = vfmadd213ps_avx512f(auVar74,auVar71,auVar77);
                          auVar71 = vfmadd231ps_avx512f(auVar71,auVar75,in_ZMM16);
                          auVar71 = vfmadd231ps_avx512f(auVar71,auVar76,in_ZMM18);
                          auVar71 = vfmadd231ps_avx512f(auVar71,in_ZMM17,auVar79);
                          uVar20 = uVar20 + 0x10;
                          auVar72 = vpaddq_avx512f(auVar72,auVar70);
                          auVar73 = vpaddq_avx512f(auVar73,auVar70);
                        } while (uVar15 != uVar20);
                        auVar72._0_4_ =
                             (uint)(bVar31 & 1) * auVar71._0_4_ |
                             (uint)!(bool)(bVar31 & 1) * auVar77._0_4_;
                        bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
                        auVar72._4_4_ = (uint)bVar8 * auVar71._4_4_ | (uint)!bVar8 * auVar77._4_4_;
                        bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
                        auVar72._8_4_ = (uint)bVar8 * auVar71._8_4_ | (uint)!bVar8 * auVar77._8_4_;
                        bVar8 = (bool)((byte)(uVar30 >> 3) & 1);
                        auVar72._12_4_ =
                             (uint)bVar8 * auVar71._12_4_ | (uint)!bVar8 * auVar77._12_4_;
                        bVar8 = (bool)((byte)(uVar30 >> 4) & 1);
                        auVar72._16_4_ =
                             (uint)bVar8 * auVar71._16_4_ | (uint)!bVar8 * auVar77._16_4_;
                        bVar8 = (bool)((byte)(uVar30 >> 5) & 1);
                        auVar72._20_4_ =
                             (uint)bVar8 * auVar71._20_4_ | (uint)!bVar8 * auVar77._20_4_;
                        bVar8 = (bool)((byte)(uVar30 >> 6) & 1);
                        auVar72._24_4_ =
                             (uint)bVar8 * auVar71._24_4_ | (uint)!bVar8 * auVar77._24_4_;
                        bVar8 = (bool)((byte)(uVar30 >> 7) & 1);
                        auVar72._28_4_ =
                             (uint)bVar8 * auVar71._28_4_ | (uint)!bVar8 * auVar77._28_4_;
                        auVar72._32_4_ =
                             (uint)(bVar32 & 1) * auVar71._32_4_ |
                             (uint)!(bool)(bVar32 & 1) * auVar77._32_4_;
                        bVar8 = (bool)(bVar32 >> 1 & 1);
                        auVar72._36_4_ =
                             (uint)bVar8 * auVar71._36_4_ | (uint)!bVar8 * auVar77._36_4_;
                        bVar8 = (bool)(bVar32 >> 2 & 1);
                        auVar72._40_4_ =
                             (uint)bVar8 * auVar71._40_4_ | (uint)!bVar8 * auVar77._40_4_;
                        bVar8 = (bool)(bVar32 >> 3 & 1);
                        auVar72._44_4_ =
                             (uint)bVar8 * auVar71._44_4_ | (uint)!bVar8 * auVar77._44_4_;
                        bVar8 = (bool)(bVar32 >> 4 & 1);
                        auVar72._48_4_ =
                             (uint)bVar8 * auVar71._48_4_ | (uint)!bVar8 * auVar77._48_4_;
                        bVar8 = (bool)(bVar32 >> 5 & 1);
                        auVar72._52_4_ =
                             (uint)bVar8 * auVar71._52_4_ | (uint)!bVar8 * auVar77._52_4_;
                        bVar8 = (bool)(bVar32 >> 6 & 1);
                        auVar72._56_4_ =
                             (uint)bVar8 * auVar71._56_4_ | (uint)!bVar8 * auVar77._56_4_;
                        auVar72._60_4_ =
                             (uint)(bVar32 >> 7) * auVar71._60_4_ |
                             (uint)!(bool)(bVar32 >> 7) * auVar77._60_4_;
                        auVar50 = vextractf64x4_avx512f(auVar72,1);
                        auVar71 = vaddps_avx512f(auVar72,ZEXT3264(auVar50));
                        auVar92._0_4_ = auVar71._16_4_ + auVar71._0_4_;
                        auVar92._4_4_ = auVar71._20_4_ + auVar71._4_4_;
                        auVar92._8_4_ = auVar71._24_4_ + auVar71._8_4_;
                        auVar92._12_4_ = auVar71._28_4_ + auVar71._12_4_;
                        auVar47 = vshufpd_avx(auVar92,auVar92,1);
                        auVar93._0_4_ = auVar47._0_4_ + auVar92._0_4_;
                        auVar93._4_4_ = auVar47._4_4_ + auVar92._4_4_;
                        auVar93._8_4_ = auVar47._8_4_ + auVar92._8_4_;
                        auVar93._12_4_ = auVar47._12_4_ + auVar92._12_4_;
                        auVar47 = vhaddps_avx(auVar93,auVar93);
                        auVar71 = ZEXT1664(auVar47);
                      }
                      fVar86 = auVar71._0_4_;
                      uVar23 = (int)uVar24 + 1;
                      uVar24 = (ulong)uVar23;
                      this = local_80;
                    } while (uVar23 != uVar13);
                  }
                  *(float *)((long)pvVar29 + lVar19 * 4) = fVar86 * (1.0 / (float)iVar21);
                  lVar19 = lVar19 + 1;
                  p_Var12 = pp_Var6[-3];
                  lVar16 = (long)*(int *)(&this->field_0xd0 + (long)p_Var12);
                } while (lVar19 < lVar16);
              }
              pvVar29 = (void *)((long)pvVar29 + lVar16 * 4);
              iVar28 = iVar28 + 1;
            } while (iVar28 < *(int *)(&this->field_0xd4 + (long)p_Var12));
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != local_d0);
      }
    }
    else {
      if (*(int *)(&this->field_0xe4 + (long)p_Var12) != 0) {
        return 0;
      }
      auVar87._0_4_ = (float)*(int *)(&this->field_0xdc + (long)p_Var12);
      auVar87._4_12_ = auVar91;
      auVar47 = vroundps_avx(local_c8,10);
      uVar13 = 0xff;
      if (*(int *)(&this->field_0xdc + (long)p_Var12) < 1) {
        uVar13 = 0;
      }
      auVar33 = vbroadcastss_avx512vl(auVar87);
      bVar8 = (bool)((byte)uVar13 & 1);
      bVar9 = (bool)((byte)(uVar13 >> 1) & 1);
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,
                 (long)iVar28 *
                 (long)(int)(float)((uint)bVar9 * auVar33._4_4_ | (uint)!bVar9 * auVar47._4_4_) *
                 (long)(int)uVar22 *
                 (long)(int)(float)((uint)bVar8 * auVar33._0_4_ | (uint)!bVar8 * auVar47._0_4_),
                 &local_d9);
      p_Var12 = this->_vptr_ROIAlign_x86_avx512[-3];
      auVar47 = vmovshdup_avx(local_c8);
      auVar33 = vmovshdup_avx(local_b8);
      original_pre_calc_for_bilinear_interpolate<float>
                (iVar17,iVar21,*(int *)(&this->field_0xd4 + (long)p_Var12),
                 *(int *)(&this->field_0xd0 + (long)p_Var12),auVar33._0_4_,local_b8._0_4_,
                 auVar47._0_4_,local_c8._0_4_,*(int *)(&this->field_0xdc + (long)p_Var12),&pre_calc)
      ;
      if (0 < (int)local_d0) {
        local_d8 = pMVar3->data;
        local_a0 = pMVar3->cstep * pMVar3->elemsize;
        local_a8 = this_00->data;
        sVar4 = this_00->cstep;
        sVar5 = this_00->elemsize;
        pp_Var6 = this->_vptr_ROIAlign_x86_avx512;
        auVar82._0_4_ = (float)iVar17;
        auVar82._4_12_ = auVar91;
        auVar90._0_4_ = (float)iVar21;
        local_98._0_8_ = pp_Var6;
        p_Var12 = pp_Var6[-3];
        auVar34 = vbroadcastss_avx512vl(auVar82);
        auVar88._4_4_ = local_c8._0_4_;
        auVar88._0_4_ = local_c8._0_4_;
        auVar88._8_4_ = local_c8._0_4_;
        auVar88._12_4_ = local_c8._0_4_;
        auVar89._4_4_ = local_b8._0_4_;
        auVar89._0_4_ = local_b8._0_4_;
        auVar89._8_4_ = local_b8._0_4_;
        auVar89._12_4_ = local_b8._0_4_;
        auVar90._4_4_ = auVar90._0_4_;
        auVar90._8_4_ = auVar90._0_4_;
        auVar90._12_4_ = auVar90._0_4_;
        uVar22 = 0;
        auVar81 = ZEXT816(0) << 0x40;
        auVar67 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar68 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar69 = vpbroadcastq_avx512f(ZEXT816(0x10));
        p_Var14 = p_Var12;
        do {
          local_c8._0_8_ = uVar22;
          if (0 < *(int *)(&this->field_0xd4 + (long)p_Var12)) {
            lVar25 = local_a0 * uVar22;
            pvVar26 = (void *)(sVar4 * sVar5 * uVar22 + (long)local_a8);
            iVar21 = 0;
            do {
              lVar18 = (long)*(int *)(&this->field_0xd0 + (long)p_Var12);
              if (0 < lVar18) {
                uVar13 = iVar21 + 1;
                uVar15 = (ulong)uVar13;
                local_b8._0_4_ = uVar13;
                auVar35 = vpinsrd_avx(ZEXT416(uVar13),iVar21,1);
                auVar35 = vcvtudq2ps_avx512vl(auVar35);
                auVar35 = vfmadd213ps_avx512vl(auVar35,auVar47,auVar33);
                auVar35 = vmaxps_avx(auVar35,auVar81);
                auVar36 = vminps_avx512vl(auVar34,auVar35);
                auVar35 = vmovshdup_avx(auVar36);
                auVar48 = ZEXT416((uint)(auVar36._0_4_ - auVar35._0_4_));
                auVar48 = vroundss_avx(auVar48,auVar48,10);
                lVar16 = 0;
                do {
                  lVar19 = lVar16 + 1;
                  auVar37 = vpinsrd_avx(ZEXT416((uint)lVar19),(int)lVar16,1);
                  auVar37 = vcvtudq2ps_avx512vl(auVar37);
                  auVar37 = vfmadd213ps_fma(auVar37,auVar88,auVar89);
                  auVar37 = vmaxps_avx(auVar37,auVar81);
                  auVar37 = vminps_avx(auVar90,auVar37);
                  auVar92 = vcvtsi2ss_avx512f(in_XMM29,*(int *)(&this->field_0xdc + (long)p_Var12));
                  bVar8 = 0 < *(int *)(&this->field_0xdc + (long)p_Var12);
                  auVar49 = vmovshdup_avx(auVar37);
                  fVar86 = auVar37._0_4_;
                  fVar94 = auVar49._0_4_;
                  auVar37 = vroundss_avx(ZEXT416((uint)(fVar86 - fVar94)),
                                         ZEXT416((uint)(fVar86 - fVar94)),10);
                  uVar13 = (uint)(float)((uint)bVar8 * auVar92._0_4_ + (uint)!bVar8 * auVar48._0_4_)
                  ;
                  iVar17 = (int)(float)((uint)bVar8 * auVar92._0_4_ + (uint)!bVar8 * auVar37._0_4_);
                  lVar18 = CONCAT44((int)((ulong)lVar18 >> 0x20),iVar17);
                  uVar15 = CONCAT71((int7)(uVar15 >> 8),fVar86 <= fVar94);
                  if ((int)uVar13 < 1) {
                    fVar80 = 0.0;
                  }
                  else {
                    uVar24 = 0;
                    auVar70 = vpbroadcastq_avx512f();
                    auVar85 = ZEXT864(0) << 0x20;
                    auVar71 = vpbroadcastq_avx512f();
                    do {
                      if (0 < iVar17) {
                        auVar72 = vpbroadcastq_avx512f();
                        auVar73 = vpaddq_avx512f(auVar72,auVar67);
                        auVar72 = vpaddq_avx512f(auVar72,auVar68);
                        auVar75._16_48_ = auVar72._16_48_;
                        auVar75._0_16_ = auVar81;
                        auVar76._4_60_ = auVar75._4_60_;
                        auVar76._0_4_ = auVar85._0_4_;
                        uVar20 = 0;
                        auVar85 = ZEXT1664(auVar76._0_16_);
                        do {
                          auVar79 = auVar85;
                          auVar85 = vpbroadcastq_avx512f();
                          auVar74 = vporq_avx512f(auVar85,auVar67);
                          auVar85 = vporq_avx512f(auVar85,auVar68);
                          uVar10 = vpcmpuq_avx512f(auVar85,auVar70,2);
                          uVar11 = vpcmpuq_avx512f(auVar74,auVar70,2);
                          bVar32 = (byte)uVar11;
                          bVar31 = (byte)uVar10;
                          uVar30 = CONCAT11(bVar32,bVar31);
                          auVar85 = vpsllq_avx512f(auVar72,5);
                          vpaddq_avx512f(auVar71,auVar85);
                          auVar85 = vpsllq_avx512f(auVar73,5);
                          auVar74 = vpaddq_avx512f(auVar71,auVar85);
                          auVar37 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
                          auVar50 = vgatherqps_avx512f(CONCAT44(_DAT_00000014,_DAT_00000010));
                          auVar51._0_8_ =
                               (ulong)(bVar32 & 1) * auVar50._0_8_ |
                               (ulong)!(bool)(bVar32 & 1) * auVar37._0_8_;
                          bVar8 = (bool)((byte)(uVar11 >> 1) & 1);
                          auVar51._8_8_ =
                               (ulong)bVar8 * auVar50._8_8_ | (ulong)!bVar8 * auVar37._8_8_;
                          auVar51._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * auVar50._16_8_;
                          auVar51._24_8_ = (ulong)((byte)(uVar11 >> 3) & 1) * auVar50._24_8_;
                          auVar37 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
                          auVar50 = vgatherqps_avx512f(*(undefined8 *)(lVar18 + 0x10));
                          auVar38._0_8_ =
                               (ulong)(bVar31 & 1) * auVar50._0_8_ |
                               (ulong)!(bool)(bVar31 & 1) * auVar37._0_8_;
                          bVar8 = (bool)((byte)(uVar10 >> 1) & 1);
                          auVar38._8_8_ =
                               (ulong)bVar8 * auVar50._8_8_ | (ulong)!bVar8 * auVar37._8_8_;
                          in_ZMM19 = vinsertf64x4_avx512f
                                               (ZEXT3264(CONCAT824((ulong)((byte)(uVar10 >> 3) & 1)
                                                                   * auVar50._24_8_,
                                                                   CONCAT816((ulong)((byte)(uVar10 
                                                  >> 2) & 1) * auVar50._16_8_,auVar38))),auVar51,1);
                          auVar37 = vxorps_avx512vl(auVar38,auVar38);
                          auVar50 = vpgatherqd_avx512f(*(undefined8 *)
                                                        ((long)&(pre_calc.
                                                  super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->pos1 +
                                                  uVar15));
                          auVar39._0_4_ =
                               (uint)(bVar32 & 1) * auVar50._0_4_ |
                               (uint)!(bool)(bVar32 & 1) * auVar37._0_4_;
                          bVar8 = (bool)((byte)(uVar11 >> 1) & 1);
                          auVar39._4_4_ = (uint)bVar8 * auVar50._4_4_ | (uint)!bVar8 * auVar37._4_4_
                          ;
                          bVar8 = (bool)((byte)(uVar11 >> 2) & 1);
                          auVar39._8_4_ = (uint)bVar8 * auVar50._8_4_ | (uint)!bVar8 * auVar37._8_4_
                          ;
                          bVar8 = (bool)((byte)(uVar11 >> 3) & 1);
                          auVar39._12_4_ =
                               (uint)bVar8 * auVar50._12_4_ | (uint)!bVar8 * auVar37._12_4_;
                          auVar52._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar50._16_4_;
                          auVar52._0_16_ = auVar39;
                          auVar52._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar50._20_4_;
                          auVar52._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar50._24_4_;
                          auVar52._28_4_ = (uint)(byte)(uVar11 >> 7) * auVar50._28_4_;
                          auVar37 = vpxord_avx512vl(auVar85._0_16_,auVar85._0_16_);
                          auVar50 = vpgatherqd_avx512f(*(undefined8 *)
                                                        ((long)&(pre_calc.
                                                  super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->pos1 +
                                                  (ulong)uVar13));
                          auVar40._0_4_ =
                               (uint)(bVar31 & 1) * auVar50._0_4_ |
                               (uint)!(bool)(bVar31 & 1) * auVar37._0_4_;
                          bVar8 = (bool)((byte)(uVar10 >> 1) & 1);
                          auVar40._4_4_ = (uint)bVar8 * auVar50._4_4_ | (uint)!bVar8 * auVar37._4_4_
                          ;
                          bVar8 = (bool)((byte)(uVar10 >> 2) & 1);
                          auVar40._8_4_ = (uint)bVar8 * auVar50._8_4_ | (uint)!bVar8 * auVar37._8_4_
                          ;
                          bVar8 = (bool)((byte)(uVar10 >> 3) & 1);
                          auVar40._12_4_ =
                               (uint)bVar8 * auVar50._12_4_ | (uint)!bVar8 * auVar37._12_4_;
                          vinserti64x4_avx512f
                                    (ZEXT3264(CONCAT428((uint)(byte)(uVar10 >> 7) * auVar50._28_4_,
                                                        CONCAT424((uint)((byte)(uVar10 >> 6) & 1) *
                                                                  auVar50._24_4_,
                                                                  CONCAT420((uint)((byte)(uVar10 >>
                                                                                         5) & 1) *
                                                                            auVar50._20_4_,
                                                                            CONCAT416((uint)((byte)(
                                                  uVar10 >> 4) & 1) * auVar50._16_4_,auVar40))))),
                                     auVar52,1);
                          auVar37 = vpxord_avx512vl(auVar40,auVar40);
                          auVar85 = vgatherdps_avx512f(*(undefined4 *)
                                                        ((long)local_d8 + (ulong)uVar13 * 4 + lVar25
                                                        ));
                          auVar78._0_4_ =
                               (uint)(bVar31 & 1) * auVar85._0_4_ |
                               (uint)!(bool)(bVar31 & 1) * auVar37._0_4_;
                          bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
                          auVar78._4_4_ = (uint)bVar8 * auVar85._4_4_ | (uint)!bVar8 * auVar37._4_4_
                          ;
                          bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
                          auVar78._8_4_ = (uint)bVar8 * auVar85._8_4_ | (uint)!bVar8 * auVar37._8_4_
                          ;
                          bVar8 = (bool)((byte)(uVar30 >> 3) & 1);
                          auVar78._12_4_ =
                               (uint)bVar8 * auVar85._12_4_ | (uint)!bVar8 * auVar37._12_4_;
                          auVar78._16_4_ = (uint)((byte)(uVar30 >> 4) & 1) * auVar85._16_4_;
                          auVar78._20_4_ = (uint)((byte)(uVar30 >> 5) & 1) * auVar85._20_4_;
                          auVar78._24_4_ = (uint)((byte)(uVar30 >> 6) & 1) * auVar85._24_4_;
                          auVar78._28_4_ = (uint)((byte)(uVar30 >> 7) & 1) * auVar85._28_4_;
                          auVar78._32_4_ = (uint)(bVar32 & 1) * auVar85._32_4_;
                          auVar78._36_4_ = (uint)(bVar32 >> 1 & 1) * auVar85._36_4_;
                          auVar78._40_4_ = (uint)(bVar32 >> 2 & 1) * auVar85._40_4_;
                          auVar78._44_4_ = (uint)(bVar32 >> 3 & 1) * auVar85._44_4_;
                          auVar78._48_4_ = (uint)(bVar32 >> 4 & 1) * auVar85._48_4_;
                          auVar78._52_4_ = (uint)(bVar32 >> 5 & 1) * auVar85._52_4_;
                          auVar78._56_4_ = (uint)(bVar32 >> 6 & 1) * auVar85._56_4_;
                          auVar78._60_4_ = (uint)(bVar32 >> 7) * auVar85._60_4_;
                          auVar50 = vgatherqps_avx512f(CONCAT44(_DAT_00000018,_DAT_00000014));
                          auVar53._8_8_ = (ulong)((byte)(uVar11 >> 1) & 1) * auVar50._8_8_;
                          auVar53._0_8_ = (ulong)(bVar32 & 1) * auVar50._0_8_;
                          auVar53._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * auVar50._16_8_;
                          auVar53._24_8_ = (ulong)((byte)(uVar11 >> 3) & 1) * auVar50._24_8_;
                          auVar37 = vpxord_avx512vl(auVar39,auVar39);
                          auVar50 = vgatherqps_avx512f(*(undefined8 *)(lVar18 + 0x14));
                          auVar41._0_8_ =
                               (ulong)(bVar31 & 1) * auVar50._0_8_ |
                               (ulong)!(bool)(bVar31 & 1) * auVar37._0_8_;
                          bVar8 = (bool)((byte)(uVar10 >> 1) & 1);
                          auVar41._8_8_ =
                               (ulong)bVar8 * auVar50._8_8_ | (ulong)!bVar8 * auVar37._8_8_;
                          auVar85 = vinsertf64x4_avx512f
                                              (ZEXT3264(CONCAT824((ulong)((byte)(uVar10 >> 3) & 1) *
                                                                  auVar50._24_8_,
                                                                  CONCAT816((ulong)((byte)(uVar10 >>
                                                                                          2) & 1) *
                                                                            auVar50._16_8_,auVar41))
                                                       ),auVar53,1);
                          auVar37 = vxorps_avx512vl(auVar41,auVar41);
                          auVar50 = vpgatherqd_avx512f(CONCAT44(_DAT_00000008,_DAT_00000004));
                          auVar54._0_4_ =
                               (uint)(bVar32 & 1) * auVar50._0_4_ |
                               (uint)!(bool)(bVar32 & 1) * auVar37._0_4_;
                          bVar8 = (bool)((byte)(uVar11 >> 1) & 1);
                          auVar54._4_4_ = (uint)bVar8 * auVar50._4_4_ | (uint)!bVar8 * auVar37._4_4_
                          ;
                          bVar8 = (bool)((byte)(uVar11 >> 2) & 1);
                          auVar54._8_4_ = (uint)bVar8 * auVar50._8_4_ | (uint)!bVar8 * auVar37._8_4_
                          ;
                          bVar8 = (bool)((byte)(uVar11 >> 3) & 1);
                          auVar54._12_4_ =
                               (uint)bVar8 * auVar50._12_4_ | (uint)!bVar8 * auVar37._12_4_;
                          auVar54._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar50._16_4_;
                          auVar54._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar50._20_4_;
                          auVar54._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar50._24_4_;
                          auVar54._28_4_ = (uint)(byte)(uVar11 >> 7) * auVar50._28_4_;
                          auVar37 = vpxord_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
                          auVar50 = vpgatherqd_avx512f(*(undefined8 *)(lVar18 + 4));
                          auVar42._0_4_ =
                               (uint)(bVar31 & 1) * auVar50._0_4_ |
                               (uint)!(bool)(bVar31 & 1) * auVar37._0_4_;
                          bVar8 = (bool)((byte)(uVar10 >> 1) & 1);
                          auVar42._4_4_ = (uint)bVar8 * auVar50._4_4_ | (uint)!bVar8 * auVar37._4_4_
                          ;
                          bVar8 = (bool)((byte)(uVar10 >> 2) & 1);
                          auVar42._8_4_ = (uint)bVar8 * auVar50._8_4_ | (uint)!bVar8 * auVar37._8_4_
                          ;
                          bVar8 = (bool)((byte)(uVar10 >> 3) & 1);
                          auVar42._12_4_ =
                               (uint)bVar8 * auVar50._12_4_ | (uint)!bVar8 * auVar37._12_4_;
                          auVar75 = vinserti64x4_avx512f
                                              (ZEXT3264(CONCAT428((uint)(byte)(uVar10 >> 7) *
                                                                  auVar50._28_4_,
                                                                  CONCAT424((uint)((byte)(uVar10 >>
                                                                                         6) & 1) *
                                                                            auVar50._24_4_,
                                                                            CONCAT420((uint)((byte)(
                                                  uVar10 >> 5) & 1) * auVar50._20_4_,
                                                  CONCAT416((uint)((byte)(uVar10 >> 4) & 1) *
                                                            auVar50._16_4_,auVar42))))),auVar54,1);
                          auVar37 = vpxord_avx512vl(auVar42,auVar42);
                          auVar76 = vgatherdps_avx512f(*(undefined4 *)
                                                        ((long)local_d8 +
                                                        (long)pre_calc.
                                                  super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start * 4 +
                                                  lVar25));
                          in_ZMM23._0_4_ =
                               (uint)(bVar31 & 1) * auVar76._0_4_ |
                               (uint)!(bool)(bVar31 & 1) * auVar37._0_4_;
                          bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
                          in_ZMM23._4_4_ =
                               (uint)bVar8 * auVar76._4_4_ | (uint)!bVar8 * auVar37._4_4_;
                          bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
                          in_ZMM23._8_4_ =
                               (uint)bVar8 * auVar76._8_4_ | (uint)!bVar8 * auVar37._8_4_;
                          bVar8 = (bool)((byte)(uVar30 >> 3) & 1);
                          in_ZMM23._12_4_ =
                               (uint)bVar8 * auVar76._12_4_ | (uint)!bVar8 * auVar37._12_4_;
                          in_ZMM23._16_4_ = (uint)((byte)(uVar30 >> 4) & 1) * auVar76._16_4_;
                          in_ZMM23._20_4_ = (uint)((byte)(uVar30 >> 5) & 1) * auVar76._20_4_;
                          in_ZMM23._24_4_ = (uint)((byte)(uVar30 >> 6) & 1) * auVar76._24_4_;
                          in_ZMM23._28_4_ = (uint)((byte)(uVar30 >> 7) & 1) * auVar76._28_4_;
                          in_ZMM23._32_4_ = (uint)(bVar32 & 1) * auVar76._32_4_;
                          in_ZMM23._36_4_ = (uint)(bVar32 >> 1 & 1) * auVar76._36_4_;
                          in_ZMM23._40_4_ = (uint)(bVar32 >> 2 & 1) * auVar76._40_4_;
                          in_ZMM23._44_4_ = (uint)(bVar32 >> 3 & 1) * auVar76._44_4_;
                          in_ZMM23._48_4_ = (uint)(bVar32 >> 4 & 1) * auVar76._48_4_;
                          in_ZMM23._52_4_ = (uint)(bVar32 >> 5 & 1) * auVar76._52_4_;
                          in_ZMM23._56_4_ = (uint)(bVar32 >> 6 & 1) * auVar76._56_4_;
                          in_ZMM23._60_4_ = (uint)(bVar32 >> 7) * auVar76._60_4_;
                          auVar37 = vxorps_avx512vl(auVar75._0_16_,auVar75._0_16_);
                          auVar50 = vgatherqps_avx512f(CONCAT44(_DAT_0000001c,_DAT_00000018));
                          auVar55._0_8_ =
                               (ulong)(bVar32 & 1) * auVar50._0_8_ |
                               (ulong)!(bool)(bVar32 & 1) * auVar37._0_8_;
                          bVar8 = (bool)((byte)(uVar11 >> 1) & 1);
                          auVar55._8_8_ =
                               (ulong)bVar8 * auVar50._8_8_ | (ulong)!bVar8 * auVar37._8_8_;
                          auVar55._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * auVar50._16_8_;
                          auVar55._24_8_ = (ulong)((byte)(uVar11 >> 3) & 1) * auVar50._24_8_;
                          auVar37 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
                          auVar50 = vgatherqps_avx512f(*(undefined8 *)(lVar18 + 0x18));
                          auVar43._0_8_ =
                               (ulong)(bVar31 & 1) * auVar50._0_8_ |
                               (ulong)!(bool)(bVar31 & 1) * auVar37._0_8_;
                          bVar8 = (bool)((byte)(uVar10 >> 1) & 1);
                          auVar43._8_8_ =
                               (ulong)bVar8 * auVar50._8_8_ | (ulong)!bVar8 * auVar37._8_8_;
                          in_ZMM22 = vinsertf64x4_avx512f
                                               (ZEXT3264(CONCAT824((ulong)((byte)(uVar10 >> 3) & 1)
                                                                   * auVar50._24_8_,
                                                                   CONCAT816((ulong)((byte)(uVar10 
                                                  >> 2) & 1) * auVar50._16_8_,auVar43))),auVar55,1);
                          auVar37 = vxorps_avx512vl(auVar43,auVar43);
                          auVar50 = vpgatherqd_avx512f(CONCAT44(_DAT_0000000c,_DAT_00000008));
                          auVar56._0_4_ =
                               (uint)(bVar32 & 1) * auVar50._0_4_ |
                               (uint)!(bool)(bVar32 & 1) * auVar37._0_4_;
                          bVar8 = (bool)((byte)(uVar11 >> 1) & 1);
                          auVar56._4_4_ = (uint)bVar8 * auVar50._4_4_ | (uint)!bVar8 * auVar37._4_4_
                          ;
                          bVar8 = (bool)((byte)(uVar11 >> 2) & 1);
                          auVar56._8_4_ = (uint)bVar8 * auVar50._8_4_ | (uint)!bVar8 * auVar37._8_4_
                          ;
                          bVar8 = (bool)((byte)(uVar11 >> 3) & 1);
                          auVar56._12_4_ =
                               (uint)bVar8 * auVar50._12_4_ | (uint)!bVar8 * auVar37._12_4_;
                          auVar56._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar50._16_4_;
                          auVar56._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar50._20_4_;
                          auVar56._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar50._24_4_;
                          auVar56._28_4_ = (uint)(byte)(uVar11 >> 7) * auVar50._28_4_;
                          auVar37 = vpxord_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
                          auVar50 = vpgatherqd_avx512f(*(undefined8 *)(lVar18 + 8));
                          auVar44._0_4_ =
                               (uint)(bVar31 & 1) * auVar50._0_4_ |
                               (uint)!(bool)(bVar31 & 1) * auVar37._0_4_;
                          bVar8 = (bool)((byte)(uVar10 >> 1) & 1);
                          auVar44._4_4_ = (uint)bVar8 * auVar50._4_4_ | (uint)!bVar8 * auVar37._4_4_
                          ;
                          bVar8 = (bool)((byte)(uVar10 >> 2) & 1);
                          auVar44._8_4_ = (uint)bVar8 * auVar50._8_4_ | (uint)!bVar8 * auVar37._8_4_
                          ;
                          bVar8 = (bool)((byte)(uVar10 >> 3) & 1);
                          auVar44._12_4_ =
                               (uint)bVar8 * auVar50._12_4_ | (uint)!bVar8 * auVar37._12_4_;
                          auVar75 = vinserti64x4_avx512f
                                              (ZEXT3264(CONCAT428((uint)(byte)(uVar10 >> 7) *
                                                                  auVar50._28_4_,
                                                                  CONCAT424((uint)((byte)(uVar10 >>
                                                                                         6) & 1) *
                                                                            auVar50._24_4_,
                                                                            CONCAT420((uint)((byte)(
                                                  uVar10 >> 5) & 1) * auVar50._20_4_,
                                                  CONCAT416((uint)((byte)(uVar10 >> 4) & 1) *
                                                            auVar50._16_4_,auVar44))))),auVar56,1);
                          auVar37 = vpxord_avx512vl(auVar44,auVar44);
                          auVar76 = vgatherdps_avx512f(*(undefined4 *)
                                                        ((long)local_d8 + uVar24 * 4 + lVar25));
                          in_ZMM25._0_4_ =
                               (uint)(bVar31 & 1) * auVar76._0_4_ |
                               (uint)!(bool)(bVar31 & 1) * auVar37._0_4_;
                          bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
                          in_ZMM25._4_4_ =
                               (uint)bVar8 * auVar76._4_4_ | (uint)!bVar8 * auVar37._4_4_;
                          bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
                          in_ZMM25._8_4_ =
                               (uint)bVar8 * auVar76._8_4_ | (uint)!bVar8 * auVar37._8_4_;
                          bVar8 = (bool)((byte)(uVar30 >> 3) & 1);
                          in_ZMM25._12_4_ =
                               (uint)bVar8 * auVar76._12_4_ | (uint)!bVar8 * auVar37._12_4_;
                          in_ZMM25._16_4_ = (uint)((byte)(uVar30 >> 4) & 1) * auVar76._16_4_;
                          in_ZMM25._20_4_ = (uint)((byte)(uVar30 >> 5) & 1) * auVar76._20_4_;
                          in_ZMM25._24_4_ = (uint)((byte)(uVar30 >> 6) & 1) * auVar76._24_4_;
                          in_ZMM25._28_4_ = (uint)((byte)(uVar30 >> 7) & 1) * auVar76._28_4_;
                          in_ZMM25._32_4_ = (uint)(bVar32 & 1) * auVar76._32_4_;
                          in_ZMM25._36_4_ = (uint)(bVar32 >> 1 & 1) * auVar76._36_4_;
                          in_ZMM25._40_4_ = (uint)(bVar32 >> 2 & 1) * auVar76._40_4_;
                          in_ZMM25._44_4_ = (uint)(bVar32 >> 3 & 1) * auVar76._44_4_;
                          in_ZMM25._48_4_ = (uint)(bVar32 >> 4 & 1) * auVar76._48_4_;
                          in_ZMM25._52_4_ = (uint)(bVar32 >> 5 & 1) * auVar76._52_4_;
                          in_ZMM25._56_4_ = (uint)(bVar32 >> 6 & 1) * auVar76._56_4_;
                          in_ZMM25._60_4_ = (uint)(bVar32 >> 7) * auVar76._60_4_;
                          auVar37 = vxorps_avx512vl(auVar75._0_16_,auVar75._0_16_);
                          auVar50 = vgatherqps_avx512f(CONCAT44(_DAT_00000020,_DAT_0000001c));
                          auVar57._0_8_ =
                               (ulong)(bVar32 & 1) * auVar50._0_8_ |
                               (ulong)!(bool)(bVar32 & 1) * auVar37._0_8_;
                          bVar8 = (bool)((byte)(uVar11 >> 1) & 1);
                          auVar57._8_8_ =
                               (ulong)bVar8 * auVar50._8_8_ | (ulong)!bVar8 * auVar37._8_8_;
                          auVar57._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * auVar50._16_8_;
                          auVar57._24_8_ = (ulong)((byte)(uVar11 >> 3) & 1) * auVar50._24_8_;
                          auVar37 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
                          auVar50 = vgatherqps_avx512f(*(undefined8 *)(lVar18 + 0x1c));
                          auVar45._0_8_ =
                               (ulong)(bVar31 & 1) * auVar50._0_8_ |
                               (ulong)!(bool)(bVar31 & 1) * auVar37._0_8_;
                          bVar8 = (bool)((byte)(uVar10 >> 1) & 1);
                          auVar45._8_8_ =
                               (ulong)bVar8 * auVar50._8_8_ | (ulong)!bVar8 * auVar37._8_8_;
                          in_ZMM24 = vinsertf64x4_avx512f
                                               (ZEXT3264(CONCAT824((ulong)((byte)(uVar10 >> 3) & 1)
                                                                   * auVar50._24_8_,
                                                                   CONCAT816((ulong)((byte)(uVar10 
                                                  >> 2) & 1) * auVar50._16_8_,auVar45))),auVar57,1);
                          auVar37 = vxorps_avx512vl(auVar45,auVar45);
                          auVar50 = vpgatherqd_avx512f(CONCAT44(_DAT_00000010,_DAT_0000000c));
                          auVar58._0_4_ =
                               (uint)(bVar32 & 1) * auVar50._0_4_ |
                               (uint)!(bool)(bVar32 & 1) * auVar37._0_4_;
                          bVar8 = (bool)((byte)(uVar11 >> 1) & 1);
                          auVar58._4_4_ = (uint)bVar8 * auVar50._4_4_ | (uint)!bVar8 * auVar37._4_4_
                          ;
                          bVar8 = (bool)((byte)(uVar11 >> 2) & 1);
                          auVar58._8_4_ = (uint)bVar8 * auVar50._8_4_ | (uint)!bVar8 * auVar37._8_4_
                          ;
                          bVar8 = (bool)((byte)(uVar11 >> 3) & 1);
                          auVar58._12_4_ =
                               (uint)bVar8 * auVar50._12_4_ | (uint)!bVar8 * auVar37._12_4_;
                          auVar58._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar50._16_4_;
                          auVar58._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar50._20_4_;
                          auVar58._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar50._24_4_;
                          auVar58._28_4_ = (uint)(byte)(uVar11 >> 7) * auVar50._28_4_;
                          in_ZMM26 = ZEXT3264(auVar58);
                          auVar37 = vpxord_avx512vl(auVar74._0_16_,auVar74._0_16_);
                          auVar50 = vpgatherqd_avx512f(*(undefined8 *)(lVar18 + 0xc));
                          auVar46._0_4_ =
                               (uint)(bVar31 & 1) * auVar50._0_4_ |
                               (uint)!(bool)(bVar31 & 1) * auVar37._0_4_;
                          bVar8 = (bool)((byte)(uVar10 >> 1) & 1);
                          auVar46._4_4_ = (uint)bVar8 * auVar50._4_4_ | (uint)!bVar8 * auVar37._4_4_
                          ;
                          bVar8 = (bool)((byte)(uVar10 >> 2) & 1);
                          auVar46._8_4_ = (uint)bVar8 * auVar50._8_4_ | (uint)!bVar8 * auVar37._8_4_
                          ;
                          bVar8 = (bool)((byte)(uVar10 >> 3) & 1);
                          auVar46._12_4_ =
                               (uint)bVar8 * auVar50._12_4_ | (uint)!bVar8 * auVar37._12_4_;
                          vinserti64x4_avx512f
                                    (ZEXT3264(CONCAT428((uint)(byte)(uVar10 >> 7) * auVar50._28_4_,
                                                        CONCAT424((uint)((byte)(uVar10 >> 6) & 1) *
                                                                  auVar50._24_4_,
                                                                  CONCAT420((uint)((byte)(uVar10 >>
                                                                                         5) & 1) *
                                                                            auVar50._20_4_,
                                                                            CONCAT416((uint)((byte)(
                                                  uVar10 >> 4) & 1) * auVar50._16_4_,auVar46))))),
                                     auVar58,1);
                          auVar37 = vpxord_avx512vl(auVar46,auVar46);
                          auVar74 = vgatherdps_avx512f(*(undefined4 *)
                                                        ((long)local_d8 + lVar18 * 4 + lVar25));
                          auVar77._0_4_ =
                               (uint)(bVar31 & 1) * auVar74._0_4_ |
                               (uint)!(bool)(bVar31 & 1) * auVar37._0_4_;
                          bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
                          auVar77._4_4_ = (uint)bVar8 * auVar74._4_4_ | (uint)!bVar8 * auVar37._4_4_
                          ;
                          bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
                          auVar77._8_4_ = (uint)bVar8 * auVar74._8_4_ | (uint)!bVar8 * auVar37._8_4_
                          ;
                          bVar8 = (bool)((byte)(uVar30 >> 3) & 1);
                          auVar77._12_4_ =
                               (uint)bVar8 * auVar74._12_4_ | (uint)!bVar8 * auVar37._12_4_;
                          auVar77._16_4_ = (uint)((byte)(uVar30 >> 4) & 1) * auVar74._16_4_;
                          auVar77._20_4_ = (uint)((byte)(uVar30 >> 5) & 1) * auVar74._20_4_;
                          auVar77._24_4_ = (uint)((byte)(uVar30 >> 6) & 1) * auVar74._24_4_;
                          auVar77._28_4_ = (uint)((byte)(uVar30 >> 7) & 1) * auVar74._28_4_;
                          auVar77._32_4_ = (uint)(bVar32 & 1) * auVar74._32_4_;
                          auVar77._36_4_ = (uint)(bVar32 >> 1 & 1) * auVar74._36_4_;
                          auVar77._40_4_ = (uint)(bVar32 >> 2 & 1) * auVar74._40_4_;
                          auVar77._44_4_ = (uint)(bVar32 >> 3 & 1) * auVar74._44_4_;
                          auVar77._48_4_ = (uint)(bVar32 >> 4 & 1) * auVar74._48_4_;
                          auVar77._52_4_ = (uint)(bVar32 >> 5 & 1) * auVar74._52_4_;
                          auVar77._56_4_ = (uint)(bVar32 >> 6 & 1) * auVar74._56_4_;
                          auVar77._60_4_ = (uint)(bVar32 >> 7) * auVar74._60_4_;
                          auVar74 = vfmadd213ps_avx512f(auVar78,in_ZMM19,auVar79);
                          auVar85 = vfmadd231ps_avx512f(auVar74,auVar85,in_ZMM23);
                          auVar85 = vfmadd231ps_avx512f(auVar85,in_ZMM22,in_ZMM25);
                          auVar85 = vfmadd231ps_avx512f(auVar85,in_ZMM24,auVar77);
                          uVar20 = uVar20 + 0x10;
                          auVar72 = vpaddq_avx512f(auVar72,auVar69);
                          auVar73 = vpaddq_avx512f(auVar73,auVar69);
                        } while ((iVar17 + 0xfU & 0xfffffff0) != uVar20);
                        auVar73._0_4_ =
                             (uint)(bVar31 & 1) * auVar85._0_4_ |
                             (uint)!(bool)(bVar31 & 1) * auVar79._0_4_;
                        bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
                        auVar73._4_4_ = (uint)bVar8 * auVar85._4_4_ | (uint)!bVar8 * auVar79._4_4_;
                        bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
                        auVar73._8_4_ = (uint)bVar8 * auVar85._8_4_ | (uint)!bVar8 * auVar79._8_4_;
                        bVar8 = (bool)((byte)(uVar30 >> 3) & 1);
                        auVar73._12_4_ =
                             (uint)bVar8 * auVar85._12_4_ | (uint)!bVar8 * auVar79._12_4_;
                        bVar8 = (bool)((byte)(uVar30 >> 4) & 1);
                        auVar73._16_4_ =
                             (uint)bVar8 * auVar85._16_4_ | (uint)!bVar8 * auVar79._16_4_;
                        bVar8 = (bool)((byte)(uVar30 >> 5) & 1);
                        auVar73._20_4_ =
                             (uint)bVar8 * auVar85._20_4_ | (uint)!bVar8 * auVar79._20_4_;
                        bVar8 = (bool)((byte)(uVar30 >> 6) & 1);
                        auVar73._24_4_ =
                             (uint)bVar8 * auVar85._24_4_ | (uint)!bVar8 * auVar79._24_4_;
                        bVar8 = (bool)((byte)(uVar30 >> 7) & 1);
                        auVar73._28_4_ =
                             (uint)bVar8 * auVar85._28_4_ | (uint)!bVar8 * auVar79._28_4_;
                        auVar73._32_4_ =
                             (uint)(bVar32 & 1) * auVar85._32_4_ |
                             (uint)!(bool)(bVar32 & 1) * auVar79._32_4_;
                        bVar8 = (bool)(bVar32 >> 1 & 1);
                        auVar73._36_4_ =
                             (uint)bVar8 * auVar85._36_4_ | (uint)!bVar8 * auVar79._36_4_;
                        bVar8 = (bool)(bVar32 >> 2 & 1);
                        auVar73._40_4_ =
                             (uint)bVar8 * auVar85._40_4_ | (uint)!bVar8 * auVar79._40_4_;
                        bVar8 = (bool)(bVar32 >> 3 & 1);
                        auVar73._44_4_ =
                             (uint)bVar8 * auVar85._44_4_ | (uint)!bVar8 * auVar79._44_4_;
                        bVar8 = (bool)(bVar32 >> 4 & 1);
                        auVar73._48_4_ =
                             (uint)bVar8 * auVar85._48_4_ | (uint)!bVar8 * auVar79._48_4_;
                        bVar8 = (bool)(bVar32 >> 5 & 1);
                        auVar73._52_4_ =
                             (uint)bVar8 * auVar85._52_4_ | (uint)!bVar8 * auVar79._52_4_;
                        bVar8 = (bool)(bVar32 >> 6 & 1);
                        auVar73._56_4_ =
                             (uint)bVar8 * auVar85._56_4_ | (uint)!bVar8 * auVar79._56_4_;
                        auVar73._60_4_ =
                             (uint)(bVar32 >> 7) * auVar85._60_4_ |
                             (uint)!(bool)(bVar32 >> 7) * auVar79._60_4_;
                        auVar50 = vextractf64x4_avx512f(auVar73,1);
                        auVar85 = vaddps_avx512f(auVar73,ZEXT3264(auVar50));
                        auVar83._0_4_ = auVar85._16_4_ + auVar85._0_4_;
                        auVar83._4_4_ = auVar85._20_4_ + auVar85._4_4_;
                        auVar83._8_4_ = auVar85._24_4_ + auVar85._8_4_;
                        auVar83._12_4_ = auVar85._28_4_ + auVar85._12_4_;
                        auVar37 = vshufpd_avx(auVar83,auVar83,1);
                        auVar84._0_4_ = auVar37._0_4_ + auVar83._0_4_;
                        auVar84._4_4_ = auVar37._4_4_ + auVar83._4_4_;
                        auVar84._8_4_ = auVar37._8_4_ + auVar83._8_4_;
                        auVar84._12_4_ = auVar37._12_4_ + auVar83._12_4_;
                        auVar37 = vhaddps_avx(auVar84,auVar84);
                        auVar85 = ZEXT1664(auVar37);
                      }
                      fVar80 = auVar85._0_4_;
                      uVar23 = (int)uVar24 + 1;
                      uVar24 = (ulong)uVar23;
                      this = local_80;
                    } while (uVar23 != uVar13);
                  }
                  auVar37 = vcvtsi2ss_avx512f(in_XMM29,iVar17 * uVar13);
                  *(uint *)((long)pvVar26 + lVar16 * 4) =
                       (uint)(auVar35._0_4_ < auVar36._0_4_ && fVar86 > fVar94) *
                       (int)(fVar80 / auVar37._0_4_);
                  p_Var12 = pp_Var6[-3];
                  lVar18 = (long)*(int *)(&this->field_0xd0 + (long)p_Var12);
                  p_Var14 = p_Var12;
                  lVar16 = lVar19;
                } while (lVar19 < lVar18);
              }
              p_Var12 = p_Var14;
              iVar21 = iVar21 + 1;
              pvVar26 = (void *)((long)pvVar26 + lVar18 * 4);
              p_Var14 = p_Var12;
            } while (iVar21 < *(int *)(&this->field_0xd4 + (long)p_Var12));
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != local_d0);
      }
    }
    if (pre_calc.super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(pre_calc.
                      super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)pre_calc.
                            super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)pre_calc.
                            super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    iVar28 = 0;
  }
  return iVar28;
}

Assistant:

int ROIAlign_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const int width = bottom_blob.w;
    const int height = bottom_blob.h;
    const size_t elemsize = bottom_blob.elemsize;
    const int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: max pool over R
    const float* roi_ptr = roi_blob;

    float roi_start_w = roi_ptr[0] * spatial_scale;
    float roi_start_h = roi_ptr[1] * spatial_scale;
    float roi_end_w = roi_ptr[2] * spatial_scale;
    float roi_end_h = roi_ptr[3] * spatial_scale;
    if (aligned)
    {
        roi_start_w -= 0.5f;
        roi_start_h -= 0.5f;
        roi_end_w -= 0.5f;
        roi_end_h -= 0.5f;
    }

    float roi_width = roi_end_w - roi_start_w;
    float roi_height = roi_end_h - roi_start_h;

    if (!aligned)
    {
        roi_width = std::max(roi_width, 1.f);
        roi_height = std::max(roi_height, 1.f);
    }

    float bin_size_w = (float)roi_width / (float)pooled_width;
    float bin_size_h = (float)roi_height / (float)pooled_height;

    if (version == 0)
    {
        // original version
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));
        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        original_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            sampling_ratio,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    // Compute pooling region for this output unit:
                    //  start (included) = ph * roi_height / pooled_height
                    //  end (excluded) = (ph + 1) * roi_height / pooled_height
                    float hstart = roi_start_h + ph * bin_size_h;
                    float wstart = roi_start_w + pw * bin_size_w;
                    float hend = roi_start_h + (ph + 1) * bin_size_h;
                    float wend = roi_start_w + (pw + 1) * bin_size_w;

                    hstart = std::min(std::max(hstart, 0.f), (float)height);
                    wstart = std::min(std::max(wstart, 0.f), (float)width);
                    hend = std::min(std::max(hend, 0.f), (float)height);
                    wend = std::min(std::max(wend, 0.f), (float)width);

                    int bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(hend - hstart));
                    int bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(wend - wstart));

                    bool is_empty = (hend <= hstart) || (wend <= wstart);
                    int area = bin_grid_h * bin_grid_w;

                    float sum = 0.f;
                    for (int by = 0; by < bin_grid_h; by++)
                    {
                        for (int bx = 0; bx < bin_grid_w; bx++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];
                            // bilinear interpolate at (x,y)
                            sum += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    outptr[pw] = is_empty ? 0.f : (sum / (float)area);
                }

                outptr += pooled_width;
            }
        }
    }
    else if (version == 1)
    {
        // the version in detectron 2
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));

        const float count = (float)std::max(roi_bin_grid_h * roi_bin_grid_w, 1);

        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        detectron2_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_bin_grid_h,
            roi_bin_grid_w,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            roi_bin_grid_h,
            roi_bin_grid_w,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    float output_val = 0.f;
                    for (int iy = 0; iy < roi_bin_grid_h; iy++)
                    {
                        for (int ix = 0; ix < roi_bin_grid_w; ix++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];

                            output_val += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    output_val /= count;
                    outptr[pw] = output_val;
                }
                outptr += pooled_width;
            }
        }
    }

    return 0;
}